

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

Error __thiscall asmjit::BaseCompiler::onAttach(BaseCompiler *this,CodeHolder *code)

{
  Error EVar1;
  undefined4 local_1c;
  
  EVar1 = BaseBuilder::onAttach(&this->super_BaseBuilder,code);
  if (EVar1 == 0) {
    onAttach();
    EVar1 = local_1c;
  }
  return EVar1;
}

Assistant:

Error BaseCompiler::onAttach(CodeHolder* code) noexcept {
  ASMJIT_PROPAGATE(Base::onAttach(code));

  const ArchTraits& archTraits = ArchTraits::byArch(code->arch());
  uint32_t nativeRegType = Environment::is32Bit(code->arch()) ? BaseReg::kTypeGp32 : BaseReg::kTypeGp64;
  _gpRegInfo.setSignature(archTraits.regTypeToSignature(nativeRegType));

  Error err = addPassT<GlobalConstPoolPass>();
  if (ASMJIT_UNLIKELY(err)) {
    onDetach(code);
    return err;
  }

  return kErrorOk;
}